

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_io.cc
# Opt level: O0

bool __thiscall comp_io_buf::close_file(comp_io_buf *this)

{
  size_type sVar1;
  reference ppgVar2;
  size_t sVar3;
  vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *in_RDI;
  vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  sVar1 = std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::size(in_RDI + 0xa8);
  if (sVar1 == 0) {
    local_1 = false;
  }
  else {
    ppgVar2 = std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::back(this_00);
    gzclose(*ppgVar2);
    std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::pop_back
              ((vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)0x2fbd0c);
    sVar3 = v_array<int>::size((v_array<int> *)(in_RDI + 0x30));
    if (sVar3 != 0) {
      v_array<int>::pop((v_array<int> *)(in_RDI + 0x30));
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool comp_io_buf::close_file()
{
  if (gz_files.size() > 0)
  {
    gzclose(gz_files.back());
    gz_files.pop_back();
    if (files.size() > 0)
      files.pop();
    return true;
  }
  return false;
}